

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void release_buffer(DECODER_MODEL *decoder_model,int idx)

{
  FRAME_BUFFER *pFVar1;
  FRAME_BUFFER *this_buffer;
  int idx_local;
  DECODER_MODEL *decoder_model_local;
  
  pFVar1 = decoder_model->frame_buffer_pool + idx;
  pFVar1->decoder_ref_count = 0;
  pFVar1->player_ref_count = 0;
  pFVar1->display_index = -1;
  pFVar1->presentation_time = -1.0;
  return;
}

Assistant:

static void release_buffer(DECODER_MODEL *const decoder_model, int idx) {
  assert(idx >= 0 && idx < BUFFER_POOL_MAX_SIZE);
  FRAME_BUFFER *const this_buffer = &decoder_model->frame_buffer_pool[idx];
  this_buffer->decoder_ref_count = 0;
  this_buffer->player_ref_count = 0;
  this_buffer->display_index = -1;
  this_buffer->presentation_time = INVALID_TIME;
}